

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZStream.h
# Opt level: O2

void __thiscall
TPZStream::Read<TPZPostProcVar>(TPZStream *this,TPZVec<TPZPostProcVar> *vec,void *context)

{
  long lVar1;
  long lVar2;
  int64_t nc;
  
  (*this->_vptr_TPZStream[0x1f])(this,&nc,1);
  (*vec->_vptr_TPZVec[3])(vec,nc);
  lVar1 = 0;
  for (lVar2 = 0; lVar2 < nc; lVar2 = lVar2 + 1) {
    (**(code **)(*(long *)((long)&(vec->fStore->super_TPZSavable)._vptr_TPZSavable + lVar1) + 0x30))
              ((long)&(vec->fStore->super_TPZSavable)._vptr_TPZSavable + lVar1,this,context);
    lVar1 = lVar1 + 0x38;
  }
  return;
}

Assistant:

void Read(TPZVec<T> &vec, void *context) {
        int64_t c, nc;
        this->Read(&nc, 1);
        vec.Resize(nc);
        if constexpr (std::is_same<std::string,T>::value ||
                      is_arithmetic_pz<T>::value){
            if (nc) this->Read(&vec[0], nc);
        }
        else{
          for (c = 0; c < nc; c++) {
            vec[c].Read(*this, context);
          }
        }
    }